

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgifhandler.cpp
# Opt level: O2

int __thiscall
QGIFFormat::decode(QGIFFormat *this,QImage *image,uchar *buffer,int length,int *nextFrameDelay,
                  int *loopCount)

{
  int iVar1;
  QRgb **ppQVar2;
  int *piVar3;
  Representation RVar4;
  ushort uVar5;
  short sVar6;
  int iVar7;
  short *psVar8;
  short *psVar9;
  Representation RVar10;
  QSize QVar11;
  bool bVar12;
  undefined1 auVar13 [14];
  undefined1 auVar14 [14];
  char cVar15;
  byte bVar16;
  uint uVar17;
  State SVar18;
  uint uVar19;
  QRgb QVar20;
  int iVar21;
  int iVar22;
  short *psVar23;
  size_t sVar24;
  QRgb *pQVar25;
  void *pvVar26;
  int iVar27;
  ulong uVar28;
  uint uVar29;
  ulong uVar30;
  int iVar31;
  long lVar32;
  QGIFFormat *this_00;
  QRgb **ppQVar33;
  short *psVar34;
  uint uVar35;
  int iVar36;
  long lVar37;
  uchar *puVar38;
  QSize QVar39;
  undefined1 auVar40 [16];
  uchar *local_90;
  long local_88;
  
  if (this->stack == (short *)0x0) {
    psVar23 = (short *)operator_new__(0x8000);
    this->stack = psVar23;
    this->table[0] = psVar23 + 0x2000;
    this->table[1] = psVar23 + 0x3000;
  }
  QImage::detach();
  local_88 = QImage::bytesPerLine();
  local_90 = (uchar *)QImage::bits();
  this->digress = false;
  ppQVar2 = &this->localcmap;
  bVar16 = 0;
  iVar31 = length;
  do {
    SVar18 = Error;
    if (((bVar16 & 1) != 0) || (iVar31 == 0)) {
      return length - iVar31;
    }
    if (Error < this->state) goto LAB_0010397c;
    bVar16 = *buffer;
    uVar17 = (uint)bVar16;
    switch(this->state) {
    case Header:
      iVar21 = this->count;
      this->count = iVar21 + 1;
      this->hold[iVar21] = bVar16;
      if (this->count == 6) {
        this->gif89 = this->hold[4] != '7' || this->hold[3] != '8';
        this->state = LogicalScreenDescriptor;
        goto LAB_00103977;
      }
      break;
    case LogicalScreenDescriptor:
      iVar21 = this->count;
      this->count = iVar21 + 1;
      this->hold[iVar21] = bVar16;
      if (this->count == 7) {
        uVar28 = *(ulong *)this->hold;
        auVar13._8_4_ = 0;
        auVar13._0_8_ = uVar28;
        auVar13._12_2_ = (short)(uVar28 >> 0x30);
        auVar14._8_2_ = (short)(uVar28 >> 0x20);
        auVar14._0_8_ = uVar28;
        auVar14._10_4_ = auVar13._10_4_;
        auVar40._6_10_ = SUB1610(ZEXT616(auVar14._8_6_) << 0x40,6);
        auVar40._4_2_ = (short)(uVar28 >> 0x10);
        auVar40._0_2_ = (ushort)uVar28;
        auVar40._2_2_ = 0;
        this->swidth = (int)auVar40._0_8_;
        this->sheight = (int)((ulong)auVar40._0_8_ >> 0x20);
        bVar16 = this->hold[4];
        this->gcmap = (bool)-((char)bVar16 >> 7);
        uVar19 = 2 << (bVar16 & 7);
        this->gncols = uVar19;
        uVar17 = (uint)this->hold[5];
        if (-1 < (char)bVar16) {
          uVar17 = 0xffffffff;
        }
        this->bgcol = uVar17;
        this->trans_index = -1;
        this->count = 0;
        this->ncols = uVar19;
        if ((bool)-((char)bVar16 >> 7) != true) goto LAB_00103868;
        this->ccount = 0;
        this->state = GlobalColorMap;
        pQVar25 = (QRgb *)operator_new__(8L << (bVar16 & 7) | 4);
        this->globalcmap = pQVar25;
        pQVar25[uVar19] = 0xffffff;
      }
      break;
    default:
      iVar21 = this->count;
      this->count = iVar21 + 1;
      this->hold[iVar21] = bVar16;
      if (this->count == 3) {
        SVar18 = this->state;
        ppQVar33 = &this->globalcmap;
        if ((SVar18 != LocalColorMap) || (ppQVar33 = ppQVar2, this->ccount < this->lncols)) {
          (*ppQVar33)[this->ccount] =
               (uint)this->hold[1] << 8 | *(int *)this->hold << 0x10 | (uint)this->hold[2] |
               0xff000000;
        }
        iVar21 = this->ccount + 1;
        this->ccount = iVar21;
        if (this->ncols <= iVar21) {
          SVar18 = (uint)(SVar18 == LocalColorMap) * 2 + Introducer;
          goto LAB_00103845;
        }
        goto LAB_00103977;
      }
      break;
    case Introducer:
      iVar21 = this->count;
      this->count = iVar21 + 1;
      this->hold[iVar21] = bVar16;
      if (uVar17 == 0x21) {
        this->state = ExtensionLabel;
      }
      else if (uVar17 == 0x3b) {
        this->state = Done;
      }
      else if (uVar17 == 0x2c) {
        this->state = ImageDescriptor;
      }
      else {
        this->digress = true;
        this->state = Error;
      }
      break;
    case ImageDescriptor:
      iVar21 = this->count;
      this->count = iVar21 + 1;
      this->hold[iVar21] = bVar16;
      if (this->count == 10) {
        uVar19 = (uint)*(ushort *)(this->hold + 5);
        iVar21 = this->swidth;
        uVar17 = uVar19;
        if (this->hold[6] < 0x40) {
          uVar17 = 0x4000;
        }
        if ((int)uVar17 < iVar21 / 10) {
          this->swidth = -1;
          iVar21 = -1;
        }
        uVar29 = (uint)*(ushort *)(this->hold + 1);
        uVar5 = *(ushort *)(this->hold + 3);
        uVar35 = (uint)*(ushort *)(this->hold + 7);
        iVar27 = this->sheight;
        uVar17 = uVar35;
        if (this->hold[8] < 0x40) {
          uVar17 = 0x4000;
        }
        if ((int)uVar17 < iVar27 / 10) {
          this->sheight = -1;
          iVar27 = -1;
        }
        if (iVar21 < 1) {
          this->swidth = uVar19 + uVar29;
        }
        if (iVar27 < 1) {
          this->sheight = uVar35 + uVar5;
        }
        uVar17 = this->trans_index;
        cVar15 = QImage::isNull();
        if (cVar15 != '\0') {
          QVar11.wd.m_i = this->swidth;
          QVar11.ht.m_i = this->sheight;
          if ((0xfffffff < (ulong)((long)this->sheight * (long)this->swidth)) ||
             (cVar15 = QImageIOHandler::allocateImage(QVar11,~uVar17 >> 0x1f | Format_RGB32,image),
             cVar15 == '\0')) goto LAB_00103d51;
          local_88 = QImage::bytesPerLine();
          local_90 = (uchar *)QImage::bits();
          if (local_90 == (uchar *)0x0) {
            local_90 = (uchar *)0x0;
          }
          else {
            sVar24 = QImage::sizeInBytes();
            memset(local_90,0,sVar24);
          }
        }
        cVar15 = QImage::isNull();
        if (cVar15 != '\0') goto LAB_00103d51;
        disposePrevious(this,image);
        this->disposed = false;
        this->left = uVar29;
        this->top = (uint)uVar5;
        this->width = uVar19;
        this->height = uVar35;
        iVar21 = uVar19 + uVar29;
        if (this->swidth <= (int)(uVar19 + uVar29)) {
          iVar21 = this->swidth;
        }
        if (iVar21 < 2) {
          iVar21 = 1;
        }
        this->right = iVar21 + -1;
        iVar21 = uVar35 + uVar5;
        if (this->sheight <= iVar21) {
          iVar21 = this->sheight;
        }
        if (iVar21 < 2) {
          iVar21 = 1;
        }
        this->bottom = iVar21 + -1;
        bVar16 = this->hold[9];
        bVar12 = (bool)-((char)bVar16 >> 7);
        this->lcmap = bVar12;
        iVar21 = 2 << (bVar16 & 7);
        this->interlace = bVar16 >> 6 & 1;
        iVar27 = 0;
        if (bVar12 != false) {
          iVar27 = iVar21;
        }
        this->lncols = iVar27;
        if (bVar12 == true) {
          if (*ppQVar2 != (QRgb *)0x0) {
            operator_delete__(*ppQVar2);
            iVar21 = this->lncols;
          }
          uVar28 = (long)iVar21 * 4 + 4;
          if (iVar21 < -1) {
            uVar28 = 0xffffffffffffffff;
          }
          pQVar25 = (QRgb *)operator_new__(uVar28);
          *ppQVar2 = pQVar25;
          pQVar25[iVar21] = 0xffffff;
        }
        else {
          iVar21 = this->gncols;
        }
        this->ncols = iVar21;
        piVar3 = &this->frame;
        *piVar3 = *piVar3 + 1;
        if ((*piVar3 == 0) &&
           ((((this->top != 0 || this->left != 0 || (this->width < this->swidth)) ||
             (this->height < this->sheight)) &&
            ((iVar21 = this->trans_index, -1 < iVar21 || (iVar21 = this->bgcol, -1 < iVar21)))))) {
          iVar27 = this->swidth;
          iVar7 = this->sheight;
          this_00 = this;
          QVar20 = color(this,(uchar)iVar21);
          fillRect(this_00,image,0,0,iVar27,iVar7,QVar20);
        }
        if (this->disposal == RestoreImage) {
          iVar27 = this->swidth + -1;
          iVar21 = this->left;
          if (iVar27 < this->left) {
            iVar21 = iVar27;
          }
          if (this->right <= iVar27) {
            iVar27 = this->right;
          }
          iVar36 = this->sheight + -1;
          iVar7 = this->top;
          if (iVar36 < this->top) {
            iVar7 = iVar36;
          }
          if (this->bottom <= iVar36) {
            iVar36 = this->bottom;
          }
          iVar1 = (iVar27 - iVar21) + 1;
          iVar36 = iVar36 - iVar7;
          iVar22 = QImage::width();
          if ((iVar22 <= iVar27 - iVar21) || (iVar27 = QImage::height(), iVar27 <= iVar36)) {
            RVar4.m_i = iVar36 + 1;
            if ((ulong)((long)RVar4.m_i * (long)iVar1) < 0x10000000) {
              iVar27 = QImage::width();
              RVar10.m_i = iVar1;
              if (iVar1 < iVar27) {
                RVar10.m_i = iVar27;
              }
              iVar27 = QImage::height();
              if (RVar4.m_i < iVar27) {
                RVar4.m_i = iVar27;
              }
              QVar39.ht.m_i = RVar4.m_i;
              QVar39.wd.m_i = RVar10.m_i;
              cVar15 = QImageIOHandler::allocateImage(QVar39,Format_RGB32,&this->backingstore);
              if (cVar15 != '\0') {
                pvVar26 = (void *)QImage::bits();
                sVar24 = QImage::sizeInBytes();
                memset(pvVar26,0,sVar24);
                goto LAB_00103c5f;
              }
            }
LAB_00103d51:
            this->state = Error;
LAB_00103d62:
            return -1;
          }
LAB_00103c5f:
          lVar32 = QImage::bytesPerLine();
          pvVar26 = (void *)QImage::bits();
          puVar38 = local_90 + iVar7 * local_88 + (long)iVar21 * 4;
          for (lVar37 = 0; lVar37 <= iVar36; lVar37 = lVar37 + 1) {
            memcpy(pvVar26,puVar38,(long)iVar1 << 2);
            pvVar26 = (void *)((long)pvVar26 + lVar32);
            puVar38 = puVar38 + local_88;
          }
        }
        this->count = 0;
        SVar18 = TableImageLZWSize;
        if (this->lcmap == true) {
          this->ccount = 0;
          SVar18 = LocalColorMap;
        }
        this->state = SVar18;
        this->x = this->left;
        this->y = this->top;
        this->accum = 0;
        this->bitcount = 0;
        this->sp = this->stack;
        this->firstcode = 0;
        this->oldcode = 0;
        this->needfirst = true;
        this->out_of_bounds = this->sheight <= this->top || this->swidth <= this->left;
      }
      break;
    case TableImageLZWSize:
      this->lzwsize = uVar17;
      if (bVar16 < 0xd) {
        uVar28 = 1L << (bVar16 & 0x3f);
        this->code_size = uVar17 + 1;
        iVar21 = (int)uVar28;
        this->clear_code = iVar21;
        this->end_code = iVar21 + 1;
        this->max_code_size = 2 << (bVar16 & 0x1f);
        this->max_code = iVar21 + 2;
        psVar23 = this->table[0];
        psVar8 = this->table[1];
        for (uVar30 = (ulong)(uint)(0 << (bVar16 & 0x1f)); uVar28 != uVar30; uVar30 = uVar30 + 1) {
          psVar23[uVar30] = 0;
          psVar8[uVar30] = (short)uVar30;
        }
        SVar18 = ImageDataBlockSize;
      }
      this->state = SVar18;
      goto LAB_00103977;
    case ImageDataBlockSize:
      this->expectcount = uVar17;
      if (bVar16 == 0) {
        this->state = Introducer;
        this->digress = true;
        this->newFrame = true;
      }
      else {
        this->state = ImageDataBlock;
      }
      break;
    case ImageDataBlock:
      this->count = this->count + 1;
      uVar19 = this->bitcount;
      iVar21 = -0x8000;
      if (uVar19 != 0xffff8000) {
        if (0x1f < uVar19) goto LAB_00103d51;
        this->accum = this->accum | uVar17 << ((byte)uVar19 & 0x1f);
        iVar21 = uVar19 + 8;
        this->bitcount = iVar21;
      }
      SVar18 = ImageDataBlock;
      while( true ) {
        iVar27 = this->code_size;
        if ((iVar21 < iVar27) || (SVar18 != ImageDataBlock)) break;
        uVar19 = ~(-1 << ((byte)iVar27 & 0x1f)) & this->accum;
        uVar17 = this->clear_code;
        this->bitcount = iVar21 - iVar27;
        this->accum = this->accum >> ((byte)iVar27 & 0x1f);
        if (uVar19 == uVar17) {
          if (this->needfirst == false) {
            this->code_size = this->lzwsize + 1;
            this->max_code_size = uVar19 * 2;
            this->max_code = uVar19 + 2;
          }
          this->needfirst = true;
        }
        else if (uVar19 == this->end_code) {
          this->bitcount = -0x8000;
        }
        else if (this->needfirst == true) {
          this->oldcode = uVar19;
          this->firstcode = uVar19;
          if (((this->out_of_bounds == false) && (iVar21 = QImage::height(), this->y < iVar21)) &&
             ((this->frame == 0 || (this->firstcode != this->trans_index)))) {
            QVar20 = color(this,(uchar)this->firstcode);
            *(QRgb *)(local_90 + (long)this->x * 4 + this->y * local_88) = QVar20;
          }
          iVar21 = this->x + 1;
          this->x = iVar21;
          if (this->swidth <= iVar21) {
            this->out_of_bounds = true;
          }
          this->needfirst = false;
          iVar27 = this->left;
          if (this->width + iVar27 <= iVar21) {
            this->x = iVar27;
            this->out_of_bounds = this->sheight <= this->y || this->swidth <= iVar27;
            nextY(this,local_90,(int)local_88);
          }
        }
        else {
          this->incode = uVar19;
          iVar21 = this->max_code;
          psVar23 = this->sp;
          uVar29 = uVar19;
          if (iVar21 <= (int)uVar19) {
            this->sp = psVar23 + 1;
            *psVar23 = (short)this->firstcode;
            psVar23 = psVar23 + 1;
            uVar29 = this->oldcode;
          }
          psVar8 = this->table[0];
          psVar9 = this->table[1];
          lVar32 = (long)psVar23 - (long)this->stack;
          while (psVar34 = psVar23 + 1, (int)(uVar17 + 2) <= (int)uVar29) {
            if (iVar21 <= (int)uVar29) goto LAB_00103d51;
            sVar6 = psVar9[(int)uVar29];
            this->sp = psVar34;
            *psVar23 = sVar6;
            if ((uVar29 == (int)psVar8[(int)uVar29]) ||
               (lVar32 = lVar32 + 2, uVar29 = (int)psVar8[(int)uVar29], psVar23 = psVar34,
               0x3ffe < lVar32)) goto LAB_00103d51;
          }
          if ((int)uVar29 < 0) goto LAB_00103d51;
          psVar8 = this->table[1];
          sVar6 = psVar8[uVar29];
          this->firstcode = (int)sVar6;
          this->sp = psVar34;
          *psVar23 = sVar6;
          if (iVar21 < 0x1000) {
            this->table[0][iVar21] = (short)this->oldcode;
            psVar8[iVar21] = sVar6;
            this->max_code = iVar21 + 1;
            iVar7 = this->max_code_size;
            if (iVar7 < 0x1000 && iVar7 <= iVar21 + 1) {
              this->max_code_size = iVar7 * 2;
              this->code_size = iVar27 + 1;
            }
          }
          this->oldcode = uVar19;
          iVar21 = QImage::height();
          if ((this->out_of_bounds == false) && (this->y < iVar21)) {
            puVar38 = local_90 + this->y * local_88;
          }
          else {
            puVar38 = (uchar *)0x0;
          }
          while (psVar23 = this->sp, this->stack < psVar23) {
            this->sp = psVar23 + -1;
            if (((this->out_of_bounds == false) && (this->y < iVar21)) &&
               ((this->frame == 0 || (this->trans_index != (uint)(byte)psVar23[-1])))) {
              QVar20 = color(this,(byte)psVar23[-1]);
              *(QRgb *)(puVar38 + (long)this->x * 4) = QVar20;
            }
            iVar27 = this->x + 1;
            this->x = iVar27;
            if (this->swidth <= iVar27) {
              this->out_of_bounds = true;
            }
            iVar7 = this->left;
            if (this->width + iVar7 <= iVar27) {
              this->x = iVar7;
              this->out_of_bounds = this->sheight <= this->y || this->swidth <= iVar7;
              nextY(this,local_90,(int)local_88);
              if ((this->out_of_bounds == false) && (this->y < iVar21)) {
                puVar38 = local_90 + this->y * local_88;
              }
            }
          }
        }
        SVar18 = this->state;
        iVar21 = this->bitcount;
      }
      this->partialNewFrame = true;
      if (this->count == this->expectcount) {
        this->count = 0;
        this->state = ImageDataBlockSize;
      }
      break;
    case ExtensionLabel:
      SVar18 = (uint)(bVar16 != 0xff) * 3 + ApplicationExtension;
      if (bVar16 == 0xf9) {
        SVar18 = GraphicControlExtension;
      }
LAB_00103845:
      this->state = SVar18;
LAB_00103977:
      this->count = 0;
      break;
    case GraphicControlExtension:
      uVar17 = this->count;
      if ((long)(int)uVar17 < 5) {
        this->hold[(int)uVar17] = bVar16;
        uVar17 = this->count;
      }
      this->count = uVar17 + 1;
      if (uVar17 == this->hold[0]) {
        disposePrevious(this,image);
        bVar16 = this->hold[1] >> 2 & 7;
        if (3 < bVar16) {
          bVar16 = 0;
        }
        this->disposal = (uint)bVar16;
        uVar17 = (uint)*(ushort *)(this->hold + 2);
        if (this->count < 4) {
          uVar17 = 1;
        }
        iVar21 = uVar17 * 10;
        if (uVar17 < 2) {
          iVar21 = 100;
        }
        *nextFrameDelay = iVar21;
        this->trans_index = -(uint)((this->hold[1] & 1) == 0) | (uint)this->hold[4];
        this->count = 0;
LAB_00103966:
        this->state = SkipBlockSize;
      }
      break;
    case ApplicationExtension:
      uVar17 = this->count;
      if ((long)(int)uVar17 < 0xb) {
        this->hold[(int)uVar17] = bVar16;
        uVar17 = this->count;
      }
      this->count = uVar17 + 1;
      if (uVar17 == this->hold[0]) {
        SVar18 = (uint)(*(long *)(this->hold + 1) != 0x455041435354454e) * 2 +
                 NetscapeExtensionBlockSize;
        goto LAB_00103845;
      }
      break;
    case NetscapeExtensionBlockSize:
      this->expectcount = uVar17;
      this->count = 0;
      if (bVar16 == 0) {
LAB_00103868:
        this->state = Introducer;
      }
      else {
        this->state = NetscapeExtensionBlock;
      }
      break;
    case NetscapeExtensionBlock:
      iVar21 = this->count;
      if ((long)iVar21 < 3) {
        this->hold[iVar21] = bVar16;
        iVar21 = this->count;
      }
      this->count = iVar21 + 1;
      if (iVar21 + 1 == this->expectcount) {
        *loopCount = (uint)*(ushort *)(this->hold + 1);
        goto LAB_00103966;
      }
      break;
    case SkipBlockSize:
      this->expectcount = uVar17;
      this->count = 0;
      if (bVar16 == 0) goto LAB_00103868;
      this->state = SkipBlock;
      break;
    case SkipBlock:
      iVar21 = this->count + 1;
      this->count = iVar21;
      if (iVar21 == this->expectcount) goto LAB_00103966;
      break;
    case Done:
      this->digress = true;
      break;
    case Error:
      goto LAB_00103d62;
    }
LAB_0010397c:
    buffer = buffer + 1;
    bVar16 = this->digress;
    iVar31 = iVar31 + -1;
  } while( true );
}

Assistant:

int QGIFFormat::decode(QImage *image, const uchar *buffer, int length,
                       int *nextFrameDelay, int *loopCount)
{
    // We are required to state that
    //    "The Graphics Interchange Format(c) is the Copyright property of
    //    CompuServe Incorporated. GIF(sm) is a Service Mark property of
    //    CompuServe Incorporated."

    if (!stack) {
        stack = new short[(1 << max_lzw_bits) * 4];
        table[0] = &stack[(1 << max_lzw_bits) * 2];
        table[1] = &stack[(1 << max_lzw_bits) * 3];
    }

    image->detach();
    qsizetype bpl = image->bytesPerLine();
    unsigned char *bits = image->bits();

#define LM(l, m) (((m)<<8)|l)
    digress = false;
    const int initial = length;
    while (!digress && length) {
        length--;
        unsigned char ch=*buffer++;
        switch (state) {
          case Header:
            hold[count++]=ch;
            if (count==6) {
                // Header
                gif89=(hold[3]!='8' || hold[4]!='7');
                state=LogicalScreenDescriptor;
                count=0;
            }
            break;
          case LogicalScreenDescriptor:
            hold[count++]=ch;
            if (count==7) {
                // Logical Screen Descriptor
                swidth=LM(hold[0], hold[1]);
                sheight=LM(hold[2], hold[3]);
                gcmap=!!(hold[4]&0x80);
                //UNUSED: bpchan=(((hold[4]&0x70)>>3)+1);
                //UNUSED: gcmsortflag=!!(hold[4]&0x08);
                gncols=2<<(hold[4]&0x7);
                bgcol=(gcmap) ? hold[5] : -1;
                //aspect=hold[6] ? double(hold[6]+15)/64.0 : 1.0;

                trans_index = -1;
                count=0;
                ncols=gncols;
                if (gcmap) {
                    ccount=0;
                    state=GlobalColorMap;
                    globalcmap = new QRgb[gncols+1]; // +1 for trans_index
                    globalcmap[gncols] = Q_TRANSPARENT;
                } else {
                    state=Introducer;
                }
            }
            break;
          case GlobalColorMap: case LocalColorMap:
            hold[count++]=ch;
            if (count==3) {
                QRgb rgb = qRgb(hold[0], hold[1], hold[2]);
                if (state == LocalColorMap) {
                    if (ccount < lncols)
                        localcmap[ccount] =  rgb;
                } else {
                    globalcmap[ccount] = rgb;
                }
                if (++ccount >= ncols) {
                    if (state == LocalColorMap)
                        state=TableImageLZWSize;
                    else
                        state=Introducer;
                }
                count=0;
            }
            break;
          case Introducer:
            hold[count++]=ch;
            switch (ch) {
              case ',':
                state=ImageDescriptor;
                break;
              case '!':
                state=ExtensionLabel;
                break;
              case ';':
                  // ### Changed: QRect(0, 0, swidth, sheight)
                state=Done;
                break;
              default:
                digress=true;
                // Unexpected Introducer - ignore block
                state=Error;
            }
            break;
          case ImageDescriptor:
            hold[count++]=ch;
            if (count==10) {
                int newleft=LM(hold[1], hold[2]);
                int newtop=LM(hold[3], hold[4]);
                int newwidth=LM(hold[5], hold[6]);
                int newheight=LM(hold[7], hold[8]);

                // disbelieve ridiculous logical screen sizes,
                // unless the image frames are also large.
                if (swidth/10 > qMax(newwidth,16384))
                    swidth = -1;
                if (sheight/10 > qMax(newheight,16384))
                    sheight = -1;

                if (swidth <= 0)
                    swidth = newleft + newwidth;
                if (sheight <= 0)
                    sheight = newtop + newheight;

                QImage::Format format = trans_index >= 0 ? QImage::Format_ARGB32 : QImage::Format_RGB32;
                if (image->isNull()) {
                    if (!withinSizeLimit(swidth, sheight)) {
                        state = Error;
                        return -1;
                    }
                    if (!QImageIOHandler::allocateImage(QSize(swidth, sheight), format, image)) {
                        state = Error;
                        return -1;
                    }
                    bpl = image->bytesPerLine();
                    bits = image->bits();
                    if (bits)
                        memset(bits, 0, image->sizeInBytes());
                }

                // Check if the previous attempt to create the image failed. If it
                // did then the image is broken and we should give up.
                if (image->isNull()) {
                    state = Error;
                    return -1;
                }

                disposePrevious(image);
                disposed = false;

                left = newleft;
                top = newtop;
                width = newwidth;
                height = newheight;

                right=qMax(0, qMin(left+width, swidth)-1);
                bottom=qMax(0, qMin(top+height, sheight)-1);
                lcmap=!!(hold[9]&0x80);
                interlace=!!(hold[9]&0x40);
                //bool lcmsortflag=!!(hold[9]&0x20);
                lncols=lcmap ? (2<<(hold[9]&0x7)) : 0;
                if (lncols) {
                    if (localcmap)
                        delete [] localcmap;
                    localcmap = new QRgb[lncols+1];
                    localcmap[lncols] = Q_TRANSPARENT;
                    ncols = lncols;
                } else {
                    ncols = gncols;
                }
                frame++;
                if (frame == 0) {
                    if (left || top || width<swidth || height<sheight) {
                        // Not full-size image - erase with bg or transparent
                        if (trans_index >= 0) {
                            fillRect(image, 0, 0, swidth, sheight, color(trans_index));
                            // ### Changed: QRect(0, 0, swidth, sheight)
                        } else if (bgcol>=0) {
                            fillRect(image, 0, 0, swidth, sheight, color(bgcol));
                            // ### Changed: QRect(0, 0, swidth, sheight)
                        }
                    }
                }

                if (disposal == RestoreImage) {
                    int l = qMin(swidth-1,left);
                    int r = qMin(swidth-1,right);
                    int t = qMin(sheight-1,top);
                    int b = qMin(sheight-1,bottom);
                    int w = r-l+1;
                    int h = b-t+1;

                    if (backingstore.width() < w
                        || backingstore.height() < h) {

                        if (!withinSizeLimit(w, h)) {
                            state = Error;
                            return -1;
                        }
                        // We just use the backing store as a byte array
                        QSize bsSize(qMax(backingstore.width(), w), qMax(backingstore.height(), h));
                        if (!QImageIOHandler::allocateImage(bsSize, QImage::Format_RGB32,
                                                            &backingstore)) {
                            state = Error;
                            return -1;
                        }
                        memset(backingstore.bits(), 0, backingstore.sizeInBytes());
                    }
                    const qsizetype dest_bpl = backingstore.bytesPerLine();
                    unsigned char *dest_data = backingstore.bits();
                    for (int ln=0; ln<h; ln++) {
                        memcpy(FAST_SCAN_LINE(dest_data, dest_bpl, ln),
                               FAST_SCAN_LINE(bits, bpl, t+ln) + l*sizeof(QRgb), w*sizeof(QRgb));
                    }
                }

                count=0;
                if (lcmap) {
                    ccount=0;
                    state=LocalColorMap;
                } else {
                    state=TableImageLZWSize;
                }
                x = left;
                y = top;
                accum = 0;
                bitcount = 0;
                sp = stack;
                firstcode = oldcode = 0;
                needfirst = true;
                out_of_bounds = left>=swidth || y>=sheight;
            }
            break;
          case TableImageLZWSize: {
            lzwsize=ch;
            if (lzwsize > max_lzw_bits) {
                state=Error;
            } else {
                code_size=lzwsize+1;
                clear_code=1<<lzwsize;
                end_code=clear_code+1;
                max_code_size=2*clear_code;
                max_code=clear_code+2;
                int i;
                for (i=0; i<clear_code; i++) {
                    table[0][i]=0;
                    table[1][i]=i;
                }
                state=ImageDataBlockSize;
            }
            count=0;
            break;
          } case ImageDataBlockSize:
            expectcount=ch;
            if (expectcount) {
                state=ImageDataBlock;
            } else {
                state=Introducer;
                digress = true;
                newFrame = true;
            }
            break;
          case ImageDataBlock:
            count++;
            if (bitcount != -32768) {
                if (bitcount < 0 || bitcount > 31) {
                    state = Error;
                    return -1;
                }
                accum |= (ch << bitcount);
                bitcount += 8;
            }
            while (bitcount>=code_size && state==ImageDataBlock) {
                int code=accum&((1<<code_size)-1);
                bitcount-=code_size;
                accum>>=code_size;

                if (code==clear_code) {
                    if (!needfirst) {
                        code_size=lzwsize+1;
                        max_code_size=2*clear_code;
                        max_code=clear_code+2;
                    }
                    needfirst=true;
                } else if (code==end_code) {
                    bitcount = -32768;
                    // Left the block end arrive
                } else {
                    if (needfirst) {
                        firstcode=oldcode=code;
                        if (!out_of_bounds && image->height() > y && ((frame == 0) || (firstcode != trans_index)))
                            ((QRgb*)FAST_SCAN_LINE(bits, bpl, y))[x] = color(firstcode);
                        x++;
                        if (x>=swidth) out_of_bounds = true;
                        needfirst=false;
                        if (x>=left+width) {
                            x=left;
                            out_of_bounds = left>=swidth || y>=sheight;
                            nextY(bits, bpl);
                        }
                    } else {
                        incode=code;
                        if (code>=max_code) {
                            *sp++=firstcode;
                            code=oldcode;
                        }
                        while (code>=clear_code+2) {
                            if (code >= max_code) {
                                state = Error;
                                return -1;
                            }
                            *sp++=table[1][code];
                            if (code==table[0][code]) {
                                state=Error;
                                return -1;
                            }
                            if (sp-stack>=(1<<(max_lzw_bits))*2) {
                                state=Error;
                                return -1;
                            }
                            code=table[0][code];
                        }
                        if (code < 0) {
                            state = Error;
                            return -1;
                        }

                        *sp++=firstcode=table[1][code];
                        code=max_code;
                        if (code<(1<<max_lzw_bits)) {
                            table[0][code]=oldcode;
                            table[1][code]=firstcode;
                            max_code++;
                            if ((max_code>=max_code_size)
                             && (max_code_size<(1<<max_lzw_bits)))
                            {
                                max_code_size*=2;
                                code_size++;
                            }
                        }
                        oldcode=incode;
                        const int h = image->height();
                        QRgb *line = nullptr;
                        if (!out_of_bounds && h > y)
                            line = (QRgb*)FAST_SCAN_LINE(bits, bpl, y);
                        while (sp>stack) {
                            const uchar index = *(--sp);
                            if (!out_of_bounds && h > y && ((frame == 0) || (index != trans_index))) {
                                line[x] = color(index);
                            }
                            x++;
                            if (x>=swidth) out_of_bounds = true;
                            if (x>=left+width) {
                                x=left;
                                out_of_bounds = left>=swidth || y>=sheight;
                                nextY(bits, bpl);
                                if (!out_of_bounds && h > y)
                                    line = (QRgb*)FAST_SCAN_LINE(bits, bpl, y);
                            }
                        }
                    }
                }
            }
            partialNewFrame = true;
            if (count==expectcount) {
                count=0;
                state=ImageDataBlockSize;
            }
            break;
          case ExtensionLabel:
            switch (ch) {
            case 0xf9:
                state=GraphicControlExtension;
                break;
            case 0xff:
                state=ApplicationExtension;
                break;
#if 0
            case 0xfe:
                state=CommentExtension;
                break;
            case 0x01:
                break;
#endif
            default:
                state=SkipBlockSize;
            }
            count=0;
            break;
          case ApplicationExtension:
            if (count<11) hold[count]=ch;
            count++;
            if (count==hold[0]+1) {
                if (qstrncmp((char*)(hold+1), "NETSCAPE", 8)==0) {
                    // Looping extension
                    state=NetscapeExtensionBlockSize;
                } else {
                    state=SkipBlockSize;
                }
                count=0;
            }
            break;
          case NetscapeExtensionBlockSize:
            expectcount=ch;
            count=0;
            if (expectcount) state=NetscapeExtensionBlock;
            else state=Introducer;
            break;
          case NetscapeExtensionBlock:
            if (count<3) hold[count]=ch;
            count++;
            if (count==expectcount) {
                *loopCount = hold[1]+hold[2]*256;
                state=SkipBlockSize; // Ignore further blocks
            }
            break;
          case GraphicControlExtension:
            if (count<5) hold[count]=ch;
            count++;
            if (count==hold[0]+1) {
                disposePrevious(image);
                uint dBits = (hold[1] >> 2) & 0x7;
                disposal = (dBits <= RestoreImage) ? Disposal(dBits) : NoDisposal;
                //UNUSED: waitforuser=!!((hold[1]>>1)&0x1);
                int delay=count>3 ? LM(hold[2], hold[3]) : 1;
                // IE and mozilla use a minimum delay of 10. With the minimum delay of 10
                // we are compatible to them and avoid huge loads on the app and xserver.
                *nextFrameDelay = (delay < 2 ? 10 : delay) * 10;

                bool havetrans=hold[1]&0x1;
                trans_index = havetrans ? hold[4] : -1;

                count=0;
                state=SkipBlockSize;
            }
            break;
          case SkipBlockSize:
            expectcount=ch;
            count=0;
            if (expectcount) state=SkipBlock;
            else state=Introducer;
            break;
          case SkipBlock:
            count++;
            if (count==expectcount) state=SkipBlockSize;
            break;
          case Done:
            digress=true;
            /* Netscape ignores the junk, so we do too.
            length++; // Unget
            state=Error; // More calls to this is an error
            */
            break;
          case Error:
            return -1; // Called again after done.
        }
    }
    return initial-length;
}